

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posixcrashhandler.cpp
# Opt level: O0

void __thiscall
Debug::PosixCrashHandler::walkStackTrace
          (PosixCrashHandler *this,char *memory,size_t memorySize,int maxFrames)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  FILE *__stream;
  pointer ppcVar6;
  char *stackFrame;
  int i;
  char **symbols;
  unique_ptr<char_*,_Debug::FreeDeleter> local_58;
  unique_ptr<char_*,_Debug::FreeDeleter> symbolsPtr;
  int fd;
  FILE *fp;
  int stackOffset;
  int frames;
  void **callstack;
  size_t framesSize;
  int maxFrames_local;
  size_t memorySize_local;
  char *memory_local;
  PosixCrashHandler *this_local;
  
  memorySize_local = (size_t)memory;
  memory_local = (char *)this;
  pcVar3 = fake_alloc((char **)&memorySize_local,(long)maxFrames << 3);
  iVar2 = ::backtrace(pcVar3,maxFrames);
  stackFrame._4_4_ = 1;
  if (*(long *)(pcVar3 + 0x10) == *(long *)(pcVar3 + 8)) {
    stackFrame._4_4_ = 2;
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    __stream = fopen(pcVar5,"a");
    if (__stream != (FILE *)0x0) {
      fseek(__stream,0,2);
      symbolsPtr._M_t.super___uniq_ptr_impl<char_*,_Debug::FreeDeleter>._M_t.
      super__Tuple_impl<0UL,_char_**,_Debug::FreeDeleter>.super__Head_base<0UL,_char_**,_false>.
      _M_head_impl._4_4_ = fileno(__stream);
      backtrace_symbols_fd
                (pcVar3,iVar2,
                 symbolsPtr._M_t.super___uniq_ptr_impl<char_*,_Debug::FreeDeleter>._M_t.
                 super__Tuple_impl<0UL,_char_**,_Debug::FreeDeleter>.
                 super__Head_base<0UL,_char_**,_false>._M_head_impl._4_4_);
      fclose(__stream);
    }
  }
  ppcVar6 = (pointer)backtrace_symbols(pcVar3,iVar2);
  std::unique_ptr<char*,Debug::FreeDeleter>::unique_ptr<Debug::FreeDeleter,void>
            ((unique_ptr<char*,Debug::FreeDeleter> *)&local_58,ppcVar6);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_58);
  if (bVar1) {
    ppcVar6 = std::unique_ptr<char_*,_Debug::FreeDeleter>::get(&local_58);
    for (; stackFrame._4_4_ < iVar2; stackFrame._4_4_ = stackFrame._4_4_ + 1) {
      memset((void *)memorySize_local,0,~((long)maxFrames << 3) + memorySize);
      pcVar5 = dlDemangle(this,*(void **)(pcVar3 + (long)stackFrame._4_4_ * 8),
                          ppcVar6[stackFrame._4_4_],stackFrame._4_4_,(char *)memorySize_local);
      if (pcVar5 != (char *)0x0) {
        std::function<void_(const_char_*)>::operator()(&this->m_backtraceCallback,pcVar5);
      }
    }
    if (iVar2 == maxFrames) {
      std::function<void_(const_char_*)>::operator()(&this->m_backtraceCallback,"[truncated]\n");
    }
  }
  std::unique_ptr<char_*,_Debug::FreeDeleter>::~unique_ptr(&local_58);
  return;
}

Assistant:

void PosixCrashHandler::walkStackTrace(char *memory, size_t memorySize, int maxFrames) {
        const size_t framesSize = maxFrames * sizeof(void*);
        void **callstack = reinterpret_cast<void**>(fake_alloc(&memory, framesSize));
        int frames = ::backtrace(callstack, maxFrames);

        const int stackOffset = callstack[2] == callstack[1] ? 2 : 1;

        if (!m_backtraceFilePath.empty()) {
            if (FILE *fp = fopen(m_backtraceFilePath.c_str(), "a")) {
                fseek(fp, 0, SEEK_END);
                int fd = fileno(fp);
                backtrace_symbols_fd(callstack, frames, fd);
                fclose(fp);
            }
        }

        std::unique_ptr<char*, FreeDeleter> symbolsPtr(backtrace_symbols(callstack, frames));
        if (!symbolsPtr) { return; }

        char **symbols = symbolsPtr.get();

        for (int i = stackOffset; i < frames; ++i) {
            memset(memory, 0, memorySize - framesSize - 1);

            char *stackFrame = dlDemangle(callstack[i], symbols[i], i, memory);
            if (stackFrame) {
                m_backtraceCallback(stackFrame);
            }
        }

        if (frames == maxFrames) {
            m_backtraceCallback("[truncated]\n");
        }
    }